

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall cs::statement_throw::~statement_throw(statement_throw *this)

{
  void *in_RSI;
  
  ~statement_throw(this);
  statement_base::operator_delete(&this->super_statement_base,in_RSI);
  return;
}

Assistant:

statement_throw() = delete;